

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_prediction_scheme_tex_coords_portable_decoder.h
# Opt level: O1

bool __thiscall
draco::
MeshPredictionSchemeTexCoordsPortableDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
::DecodePredictionData
          (MeshPredictionSchemeTexCoordsPortableDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
           *this,DecoderBuffer *buffer)

{
  long lVar1;
  vector<bool,_std::allocator<bool>_> *this_00;
  _Bit_type *p_Var2;
  bool bVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  byte bVar8;
  RAnsBitDecoder decoder;
  RAnsBitDecoder local_48;
  
  lVar1 = buffer->pos_ + 4;
  uVar5 = 0;
  if (lVar1 <= buffer->data_size_) {
    uVar5 = *(uint *)(buffer->data_ + buffer->pos_);
    buffer->pos_ = lVar1;
  }
  if ((int)uVar5 < 0 || buffer->data_size_ < lVar1) {
    bVar3 = false;
  }
  else {
    this_00 = &(this->predictor_).orientations_;
    std::vector<bool,_std::allocator<bool>_>::resize(this_00,(ulong)uVar5,false);
    RAnsBitDecoder::RAnsBitDecoder(&local_48);
    bVar3 = RAnsBitDecoder::StartDecoding(&local_48,buffer);
    if (bVar3) {
      if (0 < (int)uVar5) {
        bVar8 = 1;
        uVar7 = 0;
        do {
          bVar3 = RAnsBitDecoder::DecodeNextBit(&local_48);
          bVar8 = bVar8 ^ bVar3 ^ 1;
          p_Var2 = (this_00->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
          uVar4 = uVar7 >> 6;
          uVar6 = 1L << ((byte)uVar7 & 0x3f);
          if (bVar8 == 0) {
            uVar6 = ~uVar6 & p_Var2[uVar4];
          }
          else {
            uVar6 = uVar6 | p_Var2[uVar4];
          }
          p_Var2[uVar4] = uVar6;
          uVar7 = uVar7 + 1;
        } while (uVar5 != uVar7);
      }
      bVar3 = PredictionSchemeWrapDecodingTransform<int,_int>::DecodeTransformData
                        (&(this->
                          super_MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
                          ).
                          super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>
                          .transform_,buffer);
    }
    else {
      bVar3 = false;
    }
    RAnsBitDecoder::~RAnsBitDecoder(&local_48);
  }
  return bVar3;
}

Assistant:

bool MeshPredictionSchemeTexCoordsPortableDecoder<
    DataTypeT, TransformT, MeshDataT>::DecodePredictionData(DecoderBuffer
                                                                *buffer) {
  // Decode the delta coded orientations.
  int32_t num_orientations = 0;
  if (!buffer->Decode(&num_orientations) || num_orientations < 0) {
    return false;
  }
  predictor_.ResizeOrientations(num_orientations);
  bool last_orientation = true;
  RAnsBitDecoder decoder;
  if (!decoder.StartDecoding(buffer)) {
    return false;
  }
  for (int i = 0; i < num_orientations; ++i) {
    if (!decoder.DecodeNextBit()) {
      last_orientation = !last_orientation;
    }
    predictor_.set_orientation(i, last_orientation);
  }
  decoder.EndDecoding();
  return MeshPredictionSchemeDecoder<DataTypeT, TransformT,
                                     MeshDataT>::DecodePredictionData(buffer);
}